

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinSCANL_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double vtb;
  double vta;
  double vlb;
  double vla;
  double vsbb;
  double vsab;
  double vsaa;
  double vrb;
  double vra;
  double e;
  double local_58;
  double dStack_50;
  double local_48;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)N;
  if (N < 1) {
    uVar5 = uVar4;
  }
  lVar6 = 8;
  local_58 = scal_fact;
  dStack_50 = scal_fact;
  local_48 = scal_fact;
  for (; uVar5 << 3 != uVar4; uVar4 = uVar4 + 8) {
    kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinSCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
    eval_exc_vxc_polar(*(double *)((long)rho + uVar4 * 2),*(double *)((long)rho + uVar4 * 2 + 8),
                       *(double *)((long)sigma + lVar6 * 2 + -0x10),
                       *(double *)((long)sigma + lVar6 * 2 + -8),
                       *(double *)((long)sigma + lVar6 * 2),*(double *)((long)lapl + uVar4 * 2),
                       *(double *)((long)lapl + uVar4 * 2 + 8),*(double *)((long)tau + uVar4 * 2),
                       *(double *)((long)tau + uVar4 * 2 + 8),&e,&vra,&vrb,&vsaa,&vsab,&vsbb,&vla,
                       &vlb,&vta,&vtb);
    *(double *)((long)eps + uVar4) = e * local_48 + *(double *)((long)eps + uVar4);
    pdVar1 = (double *)((long)vrho + uVar4 * 2);
    dVar3 = pdVar1[1];
    pdVar2 = (double *)((long)vrho + uVar4 * 2);
    *pdVar2 = vra * local_58 + *pdVar1;
    pdVar2[1] = vrb * dStack_50 + dVar3;
    pdVar1 = (double *)((long)vsigma + lVar6 * 2 + -0x10);
    dVar3 = pdVar1[1];
    pdVar2 = (double *)((long)vsigma + lVar6 * 2 + -0x10);
    *pdVar2 = vsaa * local_58 + *pdVar1;
    pdVar2[1] = vsab * dStack_50 + dVar3;
    *(double *)((long)vsigma + lVar6 * 2) = vsbb * local_48 + *(double *)((long)vsigma + lVar6 * 2);
    pdVar1 = (double *)((long)vtau + uVar4 * 2);
    dVar3 = pdVar1[1];
    pdVar2 = (double *)((long)vtau + uVar4 * 2);
    *pdVar2 = vta * local_58 + *pdVar1;
    pdVar2[1] = vtb * dStack_50 + dVar3;
    pdVar1 = (double *)((long)vlapl + uVar4 * 2);
    dVar3 = pdVar1[1];
    pdVar2 = (double *)((long)vlapl + uVar4 * 2);
    *pdVar2 = vla * local_58 + *pdVar1;
    pdVar2[1] = vlb * dStack_50 + dVar3;
    lVar6 = lVar6 + 0xc;
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;

    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double e, vra, vrb, vsaa,vsab,vsbb, vla, vlb, vta, vtb;

    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      e, vra, vrb, vsaa, vsab, vsbb, vla, vlb, vta, vtb );

    eps[i]      += scal_fact * e;
    vrho_i[0]   += scal_fact * vra;
    vrho_i[1]   += scal_fact * vrb;
    vsigma_i[0] += scal_fact * vsaa;
    vsigma_i[1] += scal_fact * vsab;
    vsigma_i[2] += scal_fact * vsbb;
    vtau_i[0]   += scal_fact * vta;
    vtau_i[1]   += scal_fact * vtb;
    if(traits::needs_laplacian) {
      vlapl_i[0] += scal_fact * vla;
      vlapl_i[1] += scal_fact * vlb;
    }

  }

}